

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopFusion::CheckInit(LoopFusion *this)

{
  bool bVar1;
  long local_28;
  int64_t loop_1_init;
  int64_t loop_0_init;
  LoopFusion *this_local;
  
  loop_0_init = (int64_t)this;
  bVar1 = Loop::GetInductionInitValue(this->loop_0_,this->induction_0_,&loop_1_init);
  if (bVar1) {
    bVar1 = Loop::GetInductionInitValue(this->loop_1_,this->induction_1_,&local_28);
    if (bVar1) {
      if (loop_1_init == local_28) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LoopFusion::CheckInit() {
  int64_t loop_0_init;
  if (!loop_0_->GetInductionInitValue(induction_0_, &loop_0_init)) {
    return false;
  }

  int64_t loop_1_init;
  if (!loop_1_->GetInductionInitValue(induction_1_, &loop_1_init)) {
    return false;
  }

  if (loop_0_init != loop_1_init) {
    return false;
  }

  return true;
}